

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

UCVarValue __thiscall FFlagCVar::GetFavoriteRepDefault(FFlagCVar *this,ECVarType *type)

{
  uint uVar1;
  undefined4 extraout_var;
  undefined1 local_24 [4];
  ECVarType *pEStack_20;
  ECVarType dummy;
  ECVarType *type_local;
  FFlagCVar *this_local;
  UCVarValue def;
  
  pEStack_20 = type;
  type_local = (ECVarType *)this;
  uVar1 = (*(this->ValueVar->super_FBaseCVar)._vptr_FBaseCVar[7])(this->ValueVar,local_24);
  this_local = (FFlagCVar *)
               CONCAT71((int7)(CONCAT44(extraout_var,uVar1) >> 8),(uVar1 & this->BitVal) != 0);
  *pEStack_20 = CVAR_Bool;
  return (UCVarValue)((GUID *)this_local).String;
}

Assistant:

UCVarValue FFlagCVar::GetFavoriteRepDefault (ECVarType *type) const
{
	ECVarType dummy;
	UCVarValue def;
	def = ValueVar.GetFavoriteRepDefault (&dummy);
	def.Bool = (def.Int & BitVal) != 0;
	*type = CVAR_Bool;
	return def;
}